

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  size_t i;
  ulong uVar1;
  
  std::operator<<(ofs,"[");
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::operator<<(ofs,", ");
    }
    std::ostream::_M_insert<unsigned_long>((ulong)ofs);
  }
  std::operator<<(ofs,"]");
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<uint32_t> &v) {
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
  char buf[32];
#endif

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
    tinyusdz::itoa(v[i], buf);
    ofs << buf;
#else
    ofs << v[i];
#endif
  }
  ofs << "]";

  return ofs;
}